

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.cc
# Opt level: O0

void __thiscall
MC::MC_Parser::stack_symbol_type::stack_symbol_type(stack_symbol_type *this,stack_symbol_type *that)

{
  symbol_kind_type sVar1;
  stack_symbol_type *that_local;
  stack_symbol_type *this_local;
  
  basic_symbol<MC::MC_Parser::by_state>::basic_symbol
            (&this->super_basic_symbol<MC::MC_Parser::by_state>,
             (that->super_basic_symbol<MC::MC_Parser::by_state>).super_by_state.state,
             &(that->super_basic_symbol<MC::MC_Parser::by_state>).location);
  sVar1 = by_state::kind((by_state *)that);
  if (sVar1 == S_WORD) {
LAB_0019305f:
    value_type::move<std::__cxx11::string>
              (&(this->super_basic_symbol<MC::MC_Parser::by_state>).value,
               &(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
  }
  else {
    if (sVar1 != S_COMPARISON) {
      if ((uint)(sVar1 + ~S_COMPARISON) < 3) goto LAB_0019305f;
      if (sVar1 != S_INTNUM) {
        if (sVar1 == S_BOOL) {
          value_type::move<bool>
                    (&(this->super_basic_symbol<MC::MC_Parser::by_state>).value,
                     &(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
          goto LAB_0019307a;
        }
        if (sVar1 == S_APPROXNUM) {
          value_type::move<float>
                    (&(this->super_basic_symbol<MC::MC_Parser::by_state>).value,
                     &(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
          goto LAB_0019307a;
        }
        if (sVar1 == S_USERVAR) goto LAB_0019305f;
        if (((((1 < (uint)(sVar1 + ~S_opt_where)) && (sVar1 != S_table_references)) &&
             (1 < (uint)(sVar1 + ~S_delete_stmt))) &&
            ((sVar1 != S_insert_opts && (sVar1 != S_insert_vals_list)))) &&
           ((sVar1 != S_create_col_list &&
            ((3 < (uint)(sVar1 + ~S_280_1) && (sVar1 != S_data_type)))))) goto LAB_0019307a;
      }
    }
    value_type::move<int>
              (&(this->super_basic_symbol<MC::MC_Parser::by_state>).value,
               &(that->super_basic_symbol<MC::MC_Parser::by_state>).value);
  }
LAB_0019307a:
  (that->super_basic_symbol<MC::MC_Parser::by_state>).super_by_state.state = '\0';
  return;
}

Assistant:

MC_Parser::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_BOOL: // BOOL
        value.YY_MOVE_OR_COPY< bool > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_APPROXNUM: // APPROXNUM
        value.YY_MOVE_OR_COPY< float > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_COMPARISON: // COMPARISON
      case symbol_kind::S_INTNUM: // INTNUM
      case symbol_kind::S_column_list: // column_list
      case symbol_kind::S_select_expr_list: // select_expr_list
      case symbol_kind::S_table_references: // table_references
      case symbol_kind::S_delete_opts: // delete_opts
      case symbol_kind::S_delete_list: // delete_list
      case symbol_kind::S_insert_opts: // insert_opts
      case symbol_kind::S_insert_vals_list: // insert_vals_list
      case symbol_kind::S_create_col_list: // create_col_list
      case symbol_kind::S_column_atts: // column_atts
      case symbol_kind::S_opt_length: // opt_length
      case symbol_kind::S_opt_binary: // opt_binary
      case symbol_kind::S_opt_uz: // opt_uz
      case symbol_kind::S_data_type: // data_type
        value.YY_MOVE_OR_COPY< int > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_WORD: // WORD
      case symbol_kind::S_HLH: // HLH
      case symbol_kind::S_NAME: // NAME
      case symbol_kind::S_STRING: // STRING
      case symbol_kind::S_USERVAR: // USERVAR
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }